

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O0

void * nn_chunkref_getchunk(nn_chunkref *self)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  byte *in_RDI;
  void *chunk;
  nn_chunkref_chunk *ch;
  int rc;
  void **in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  void **local_8;
  
  if (*in_RDI == 0xff) {
    *in_RDI = 0;
    local_8 = *(void ***)(in_RDI + 8);
  }
  else {
    iVar1 = nn_chunk_alloc(CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                           (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),in_stack_ffffffffffffffd8
                          );
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      __errno_location();
      pcVar2 = nn_err_strerror((int)((ulong)__stream >> 0x20));
      puVar3 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/chunkref.c"
              ,0x5a);
      fflush(_stderr);
      nn_err_abort();
    }
    memcpy(in_stack_ffffffffffffffd8,in_RDI + 1,(ulong)*in_RDI);
    *in_RDI = 0;
    local_8 = in_stack_ffffffffffffffd8;
  }
  return local_8;
}

Assistant:

void *nn_chunkref_getchunk (struct nn_chunkref *self)
{
    int rc;
    struct nn_chunkref_chunk *ch;
    void *chunk;

    if (self->u.ref [0] == 0xff) {
        ch = (struct nn_chunkref_chunk*) self;
        self->u.ref [0] = 0;
        return ch->chunk;
    }

    rc = nn_chunk_alloc (self->u.ref [0], 0, &chunk);
    errno_assert (rc == 0);
    memcpy (chunk, &self->u.ref [1], self->u.ref [0]);
    self->u.ref [0] = 0;
    return chunk;
}